

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserAnimation::ParseValue
          (PropertyParserAnimation *this,Property *property,String *value,ParameterMap *param_3)

{
  bool local_8d;
  bool result;
  String local_80;
  undefined1 local_60 [8];
  String lowercase_value;
  StringList list_of_values;
  ParameterMap *param_3_local;
  String *value_local;
  Property *property_local;
  PropertyParserAnimation *this_local;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(lowercase_value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)&local_80,(string *)value);
  StringUtilities::ToLower((String *)local_60,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  StringUtilities::ExpandString
            ((StringList *)((long)&lowercase_value.field_2 + 8),(String *)local_60,',');
  ::std::__cxx11::string::~string((string *)local_60);
  local_8d = false;
  if (this->type == ANIMATION_PARSER) {
    local_8d = ParseAnimation(property,(StringList *)((long)&lowercase_value.field_2 + 8));
  }
  else if (this->type == TRANSITION_PARSER) {
    local_8d = ParseTransition(property,(StringList *)((long)&lowercase_value.field_2 + 8));
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(lowercase_value.field_2._M_local_buf + 8));
  return local_8d;
}

Assistant:

bool PropertyParserAnimation::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	StringList list_of_values;
	{
		auto lowercase_value = StringUtilities::ToLower(value);
		StringUtilities::ExpandString(list_of_values, lowercase_value, ',');
	}

	bool result = false;

	if (type == ANIMATION_PARSER)
	{
		result = ParseAnimation(property, list_of_values);
	}
	else if (type == TRANSITION_PARSER)
	{
		result = ParseTransition(property, list_of_values);
	}

	return result;
}